

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ast.cpp
# Opt level: O1

string * __thiscall ast::Sub::toString_abi_cxx11_(string *__return_storage_ptr__,Sub *this)

{
  ostringstream msg;
  ostringstream local_190 [112];
  ios_base local_120 [264];
  
  std::__cxx11::ostringstream::ostringstream(local_190);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_190,"(",1);
  ast::operator<<((ostream *)local_190,(this->super_BinaryOp).LeftOp);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_190," - ",3);
  ast::operator<<((ostream *)local_190,(this->super_BinaryOp).RightOp);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_190,")",1);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream(local_190);
  std::ios_base::~ios_base(local_120);
  return __return_storage_ptr__;
}

Assistant:

std::string ast::Sub::toString() const {
    std::ostringstream msg;
    msg << "(";
    msg << LeftOp;
    msg << " - ";
    msg << RightOp;
    msg << ")";
    return msg.str();
}